

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progressbar.cpp
# Opt level: O2

void __thiscall
QtMWidgets::ProgressBarPrivate::ProgressBarPrivate(ProgressBarPrivate *this,ProgressBar *parent)

{
  this->q = parent;
  this->minimum = 0;
  this->maximum = 0;
  this->value = -1;
  this->lastPaintedValue = -1;
  this->orientation = Horizontal;
  this->invertedAppearance = false;
  this->grooveHeight = 3;
  (this->highlightColor).cspec = Invalid;
  (this->highlightColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = 0;
  (this->grooveColor).cspec = Invalid;
  (this->grooveColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->grooveColor).ct + 2) = 0;
  (this->animationColor).cspec = Invalid;
  (this->animationColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(this->animationColor).ct + 2) = 0;
  this->animation = (QVariantAnimation *)0x0;
  this->animate = true;
  return;
}

Assistant:

ProgressBarPrivate( ProgressBar * parent )
		:	q( parent )
		,	minimum( 0 )
		,	maximum( 0 )
		,	value( -1 )
		,	lastPaintedValue( -1 )
		,	orientation( Qt::Horizontal )
		,	invertedAppearance( false )
		,	grooveHeight( 3 )
		,	animation( 0 )
		,	animate( true )
	{
	}